

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[11],bool,char>(JObject *this,char (*k) [11],bool *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[11],_bool>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[11],_bool> field;
  char *c_local;
  bool *v_local;
  char (*k_local) [11];
  JObject *this_local;
  
  field.v = (bool *)c;
  Field<char[11],_bool>::Field((Field<char[11],_bool> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[11],bool>,char>((Field<char[11],_bool> *)local_38,field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }